

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall
leveldb::RecoveryTest_NoLogFiles_Test::~RecoveryTest_NoLogFiles_Test
          (RecoveryTest_NoLogFiles_Test *this)

{
  RecoveryTest_NoLogFiles_Test *this_local;
  
  RecoveryTest::~RecoveryTest(&this->super_RecoveryTest);
  return;
}

Assistant:

TEST_F(RecoveryTest, NoLogFiles) {
  ASSERT_LEVELDB_OK(Put("foo", "bar"));
  ASSERT_EQ(1, RemoveLogFiles());
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
}